

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.h
# Opt level: O3

void __thiscall bloaty::dwarf::LineInfoReader::~LineInfoReader(LineInfoReader *this)

{
  pointer puVar1;
  pointer pFVar2;
  pointer pbVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->expanded_filenames_);
  puVar1 = (this->standard_opcode_lengths_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->standard_opcode_lengths_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pFVar2 = (this->filenames_).
           super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->filenames_).
                                 super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  pbVar3 = (this->include_directories_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (pointer)0x0) {
    operator_delete(pbVar3,(long)(this->include_directories_).
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar3);
    return;
  }
  return;
}

Assistant:

LineInfoReader(const File& file) : file_(file), info_(0) {}